

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O0

int Str_ObjCreate(Str_Ntk_t *p,int Type,int nFanins,int *pFanins)

{
  int iVar1;
  Str_Obj_t *pSVar2;
  int local_2c;
  int i;
  Str_Obj_t *pObj;
  int *pFanins_local;
  int nFanins_local;
  int Type_local;
  Str_Ntk_t *p_local;
  
  pSVar2 = p->pObjs + p->nObjs;
  if (p->nObjsAlloc <= p->nObjs) {
    __assert_fail("p->nObjs < p->nObjsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                  ,0x70,"int Str_ObjCreate(Str_Ntk_t *, int, int, int *)");
  }
  *(uint *)pSVar2 = *(uint *)pSVar2 & 0xfffffff0 | Type & 0xfU;
  *(uint *)pSVar2 = *(uint *)pSVar2 & 0xf | nFanins << 4;
  iVar1 = Vec_IntSize(&p->vFanins);
  pSVar2->iOffset = iVar1;
  pSVar2->iCopy = -1;
  pSVar2->iTop = -1;
  local_2c = 0;
  while( true ) {
    if (nFanins <= local_2c) {
      p->nObjCount[Type] = p->nObjCount[Type] + 1;
      iVar1 = p->nObjs;
      p->nObjs = iVar1 + 1;
      iVar1 = Abc_Var2Lit(iVar1,0);
      return iVar1;
    }
    Vec_IntPush(&p->vFanins,pFanins[local_2c]);
    if (pFanins[local_2c] < 0) break;
    local_2c = local_2c + 1;
  }
  __assert_fail("pFanins[i] >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                ,0x78,"int Str_ObjCreate(Str_Ntk_t *, int, int, int *)");
}

Assistant:

static inline int Str_ObjCreate( Str_Ntk_t * p, int Type, int nFanins, int * pFanins )
{
    Str_Obj_t * pObj = p->pObjs + p->nObjs; int i;
    assert( p->nObjs < p->nObjsAlloc );
    pObj->Type    = Type;
    pObj->nFanins = nFanins;
    pObj->iOffset = Vec_IntSize(&p->vFanins);
    pObj->iTop    = pObj->iCopy = -1;
    for ( i = 0; i < nFanins; i++ )
    {
        Vec_IntPush( &p->vFanins, pFanins[i] );
        assert( pFanins[i] >= 0 );
    }
    p->nObjCount[Type]++;
    return Abc_Var2Lit( p->nObjs++, 0 );
}